

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

void __thiscall wasm::SExpressionWasmBuilder::parseImport(SExpressionWasmBuilder *this,Element *s)

{
  int iVar1;
  Module *pMVar2;
  Name name_;
  Name name__00;
  Name name__01;
  Name name__02;
  bool bVar3;
  size_t sVar4;
  Element *pEVar5;
  ulong uVar6;
  ParseException *pPVar7;
  pointer pFVar8;
  mapped_type *pmVar9;
  pointer pGVar10;
  pointer pTVar11;
  Address AVar12;
  pointer pMVar13;
  pointer pTVar14;
  char *pcVar15;
  uint uVar16;
  IString str;
  IString str_00;
  IString str_01;
  IString str_02;
  IString str_03;
  uint local_5f8;
  Element *local_5f0;
  bool local_53b;
  allocator<char> local_539;
  string local_538;
  size_t local_518;
  size_t sStack_510;
  Name local_508;
  size_t local_4f8;
  size_t sStack_4f0;
  Name local_4e8;
  size_t local_4d8;
  size_t sStack_4d0;
  Signature local_4c0;
  HeapType local_4b0;
  HeapType tagType;
  __single_object tag;
  string local_498;
  undefined8 local_478;
  undefined8 uStack_470;
  Element *local_460;
  Element *limits;
  size_t sStack_450;
  Name local_448;
  size_t local_438;
  size_t sStack_430;
  Name local_428;
  size_t local_418;
  size_t sStack_410;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_400;
  __single_object memory;
  Element *maxElem;
  Element *initElem;
  Name local_3b8;
  size_t local_3a8;
  size_t sStack_3a0;
  Name local_398;
  size_t local_388;
  size_t sStack_380;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> local_378;
  __single_object table;
  Name local_360;
  size_t local_350;
  size_t local_348;
  Name local_340;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *local_330;
  value_type *global;
  size_t sStack_320;
  Name local_318;
  size_t local_308;
  size_t sStack_300;
  Name local_2f8;
  size_t local_2e8;
  size_t sStack_2e0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_2d8;
  __single_object func;
  Index j;
  Element *inner;
  string local_2b8;
  undefined1 auStack_298 [8];
  IString base;
  string local_280;
  undefined1 auStack_260 [8];
  IString module;
  string local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  Name local_1e8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  Name local_198;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Name local_148 [2];
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  Name local_e8;
  byte local_d1;
  undefined1 auStack_d0 [7];
  bool hasExplicitName;
  Name local_c0;
  string_view local_b0;
  Name local_a0;
  undefined1 auStack_90 [8];
  Name name;
  undefined1 auStack_78 [4];
  Index newStyleInner;
  Element *local_68;
  size_t local_60;
  Element *local_58;
  size_t local_50;
  Element *local_48;
  size_t local_40;
  Element *local_38;
  size_t local_30;
  int local_28;
  bool local_21;
  ExternalKind kind;
  bool newStyle;
  size_t i;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  
  _kind = 1;
  i = (size_t)s;
  s_local = (Element *)this;
  sVar4 = Element::size(s);
  local_53b = false;
  if (sVar4 == 4) {
    pEVar5 = Element::operator[]((Element *)i,3);
    local_53b = Element::isList(pEVar5);
  }
  local_21 = local_53b;
  local_28 = -1;
  if (local_53b != false) {
    pEVar5 = Element::operator[]((Element *)i,3);
    local_38 = FUNC;
    local_30 = DAT_027e5760;
    str.str._M_str = &FUNC->isList_;
    str.str._M_len = DAT_027e5760;
    bVar3 = elementStartsWith((wasm *)pEVar5,FUNC,str);
    if (bVar3) {
      local_28 = 0;
    }
    else {
      pEVar5 = Element::operator[]((Element *)i,3);
      local_48 = MEMORY;
      local_40 = DAT_027e5790;
      str_00.str._M_str = &MEMORY->isList_;
      str_00.str._M_len = DAT_027e5790;
      bVar3 = elementStartsWith((wasm *)pEVar5,MEMORY,str_00);
      if (bVar3) {
        local_28 = 2;
      }
      else {
        pEVar5 = Element::operator[]((Element *)i,3);
        local_58 = TABLE;
        local_50 = DAT_027e57e0;
        str_01.str._M_str = &TABLE->isList_;
        str_01.str._M_len = DAT_027e57e0;
        bVar3 = elementStartsWith((wasm *)pEVar5,TABLE,str_01);
        if (bVar3) {
          local_28 = 1;
        }
        else {
          pEVar5 = Element::operator[]((Element *)i,3);
          local_68 = GLOBAL;
          local_60 = DAT_027e5750;
          str_02.str._M_str = &GLOBAL->isList_;
          str_02.str._M_len = DAT_027e5750;
          bVar3 = elementStartsWith((wasm *)pEVar5,GLOBAL,str_02);
          if (bVar3) {
            local_28 = 3;
          }
          else {
            pEVar5 = Element::operator[]((Element *)i,3);
            pEVar5 = Element::operator[](pEVar5,0);
            _auStack_78 = (string_view)Element::str(pEVar5);
            bVar3 = IString::operator==((IString *)auStack_78,(IString *)TAG);
            if (bVar3) {
              local_28 = 4;
            }
            else {
              local_21 = false;
            }
          }
        }
      }
    }
  }
  name.super_IString.str._M_str._4_4_ = 1;
  wasm::Name::Name((Name *)auStack_90);
  sVar4 = Element::size((Element *)i);
  if (3 < sVar4) {
    pEVar5 = Element::operator[]((Element *)i,3);
    bVar3 = Element::isStr(pEVar5);
    if (bVar3) {
      uVar16 = (uint)_kind;
      _kind = _kind + 1;
      pEVar5 = Element::operator[]((Element *)i,uVar16);
      local_b0 = (string_view)Element::str(pEVar5);
      wasm::Name::Name(&local_a0,(IString)local_b0);
      wasm::Name::operator=((Name *)auStack_90,&local_a0);
      goto LAB_01c4924c;
    }
  }
  if ((local_21 & 1U) != 0) {
    uVar6 = (ulong)name.super_IString.str._M_str._4_4_;
    pEVar5 = Element::operator[]((Element *)i,3);
    sVar4 = Element::size(pEVar5);
    if (uVar6 < sVar4) {
      pEVar5 = Element::operator[]((Element *)i,3);
      pEVar5 = Element::operator[](pEVar5,name.super_IString.str._M_str._4_4_);
      bVar3 = Element::dollared(pEVar5);
      if (bVar3) {
        pEVar5 = Element::operator[]((Element *)i,3);
        uVar16 = name.super_IString.str._M_str._4_4_;
        name.super_IString.str._M_str._4_4_ = name.super_IString.str._M_str._4_4_ + 1;
        pEVar5 = Element::operator[](pEVar5,uVar16);
        _auStack_d0 = (string_view)Element::str(pEVar5);
        wasm::Name::Name(&local_c0,(IString)_auStack_d0);
        wasm::Name::operator=((Name *)auStack_90,&local_c0);
      }
    }
  }
LAB_01c4924c:
  local_d1 = IString::is((IString *)auStack_90);
  if (!(bool)local_d1) {
    if (local_28 == 0) {
      iVar1 = this->functionCounter;
      this->functionCounter = iVar1 + 1;
      std::__cxx11::to_string(&local_128,iVar1);
      std::operator+(&local_108,"fimport$",&local_128);
      wasm::Name::Name(&local_e8,&local_108);
      wasm::Name::operator=((Name *)auStack_90,&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                (&this->functionNames,(value_type *)auStack_90);
    }
    else if (local_28 != 3) {
      if (local_28 == 2) {
        iVar1 = this->memoryCounter;
        this->memoryCounter = iVar1 + 1;
        std::__cxx11::to_string(&local_188,iVar1);
        std::operator+(&local_168,"mimport$",&local_188);
        wasm::Name::Name(local_148,&local_168);
        wasm::Name::operator=((Name *)auStack_90,local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
      }
      else if (local_28 == 1) {
        iVar1 = this->tableCounter;
        this->tableCounter = iVar1 + 1;
        std::__cxx11::to_string(&local_1d8,iVar1);
        std::operator+(&local_1b8,"timport$",&local_1d8);
        wasm::Name::Name(&local_198,&local_1b8);
        wasm::Name::operator=((Name *)auStack_90,&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
      }
      else {
        if (local_28 != 4) {
          module.str._M_str._6_1_ = 1;
          pPVar7 = (ParseException *)__cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,"invalid import",
                     (allocator<char> *)((long)&module.str._M_str + 7));
          pEVar5 = Element::operator[]((Element *)i,3);
          sVar4 = pEVar5->line;
          pEVar5 = Element::operator[]((Element *)i,3);
          ParseException::ParseException(pPVar7,&local_248,sVar4,pEVar5->col);
          module.str._M_str._6_1_ = 0;
          __cxa_throw(pPVar7,&ParseException::typeinfo,ParseException::~ParseException);
        }
        iVar1 = this->tagCounter;
        this->tagCounter = iVar1 + 1;
        std::__cxx11::to_string(&local_228,iVar1);
        std::operator+(&local_208,"eimport$",&local_228);
        wasm::Name::Name(&local_1e8,&local_208);
        wasm::Name::operator=((Name *)auStack_90,&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_228);
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                  (&this->tagNames,(value_type *)auStack_90);
      }
    }
  }
  if ((local_21 & 1U) == 0) {
    local_28 = 0;
  }
  uVar16 = (uint)_kind;
  _kind = _kind + 1;
  pEVar5 = Element::operator[]((Element *)i,uVar16);
  _auStack_260 = (string_view)Element::str(pEVar5);
  pEVar5 = Element::operator[]((Element *)i,(uint)_kind);
  bVar3 = Element::isStr(pEVar5);
  if (!bVar3) {
    base.str._M_str._6_1_ = 1;
    pPVar7 = (ParseException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"no name for import",
               (allocator<char> *)((long)&base.str._M_str + 7));
    pEVar5 = Element::operator[]((Element *)i,kind);
    sVar4 = pEVar5->line;
    pEVar5 = Element::operator[]((Element *)i,kind);
    ParseException::ParseException(pPVar7,&local_280,sVar4,pEVar5->col);
    base.str._M_str._6_1_ = 0;
    __cxa_throw(pPVar7,&ParseException::typeinfo,ParseException::~ParseException);
  }
  pEVar5 = Element::operator[]((Element *)i,(uint)_kind);
  _auStack_298 = (string_view)Element::str(pEVar5);
  sVar4 = IString::size((IString *)auStack_260);
  if ((sVar4 == 0) || (sVar4 = IString::size((IString *)auStack_298), sVar4 == 0)) {
    inner._6_1_ = 1;
    pPVar7 = (ParseException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"imports must have module and base",
               (allocator<char> *)((long)&inner + 7));
    pEVar5 = Element::operator[]((Element *)i,kind);
    sVar4 = pEVar5->line;
    pEVar5 = Element::operator[]((Element *)i,kind);
    ParseException::ParseException(pPVar7,&local_2b8,sVar4,pEVar5->col);
    inner._6_1_ = 0;
    __cxa_throw(pPVar7,&ParseException::typeinfo,ParseException::~ParseException);
  }
  _kind = _kind + 1;
  if ((local_21 & 1U) == 0) {
    local_5f0 = (Element *)i;
  }
  else {
    local_5f0 = Element::operator[]((Element *)i,3);
  }
  if ((local_21 & 1U) == 0) {
    local_5f8 = (uint)_kind;
  }
  else {
    local_5f8 = name.super_IString.str._M_str._4_4_;
  }
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ = local_5f8;
  if (local_28 == 0) {
    std::make_unique<wasm::Function>();
    uVar6 = (ulong)func._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_;
    pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_2d8);
    sVar4 = parseTypeUse(this,local_5f0,uVar6,&pFVar8->type);
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ = (uint)sVar4;
    pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_2d8);
    local_2e8 = (size_t)auStack_90;
    sStack_2e0 = name.super_IString.str._M_len;
    name__02.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
    name__02.super_IString.str._M_len = (size_t)auStack_90;
    Named::setName((Named *)pFVar8,name__02,(bool)(local_d1 & 1));
    local_308 = (size_t)auStack_260;
    sStack_300 = module.str._M_len;
    wasm::Name::Name(&local_2f8,(IString)_auStack_260);
    pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_2d8);
    wasm::Name::operator=(&(pFVar8->super_Importable).module,&local_2f8);
    global = (value_type *)auStack_298;
    sStack_320 = base.str._M_len;
    wasm::Name::Name(&local_318,(IString)_auStack_298);
    pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_2d8);
    wasm::Name::operator=(&(pFVar8->super_Importable).base,&local_318);
    pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_2d8);
    pmVar9 = std::
             map<wasm::Name,_wasm::HeapType,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::HeapType>_>_>
             ::operator[](&this->functionTypes,(key_type *)auStack_90);
    pmVar9->id = (pFVar8->type).id;
    pMVar2 = this->wasm;
    pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::release
                       (&local_2d8);
    Module::addFunction(pMVar2,pFVar8);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_2d8);
  }
  else if (local_28 == 3) {
    parseGlobal(this,local_5f0,true);
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ =
         func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ + 1;
    local_330 = std::
                vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ::back(&this->wasm->globals);
    local_350 = (size_t)auStack_260;
    local_348 = module.str._M_len;
    wasm::Name::Name(&local_340,(IString)_auStack_260);
    pGVar10 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                        (local_330);
    wasm::Name::operator=(&(pGVar10->super_Importable).module,&local_340);
    table._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
    super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
         (__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)auStack_298;
    wasm::Name::Name(&local_360,(IString)_auStack_298);
    pGVar10 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                        (local_330);
    wasm::Name::operator=(&(pGVar10->super_Importable).base,&local_360);
  }
  else if (local_28 == 1) {
    std::make_unique<wasm::Table>();
    pTVar11 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                        (&local_378);
    local_388 = (size_t)auStack_90;
    sStack_380 = name.super_IString.str._M_len;
    name__01.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
    name__01.super_IString.str._M_len = (size_t)auStack_90;
    Named::setName((Named *)pTVar11,name__01,(bool)(local_d1 & 1));
    local_3a8 = (size_t)auStack_260;
    sStack_3a0 = module.str._M_len;
    wasm::Name::Name(&local_398,(IString)_auStack_260);
    pTVar11 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                        (&local_378);
    wasm::Name::operator=(&(pTVar11->super_Importable).module,&local_398);
    wasm::Name::Name(&local_3b8,(IString)_auStack_298);
    pTVar11 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                        (&local_378);
    wasm::Name::operator=(&(pTVar11->super_Importable).base,&local_3b8);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              (&this->tableNames,(value_type *)auStack_90);
    uVar6 = (ulong)func._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_;
    sVar4 = Element::size(local_5f0);
    uVar16 = func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_;
    if (uVar6 < sVar4 - 1) {
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ =
           func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ + 1;
      pEVar5 = Element::operator[](local_5f0,uVar16);
      AVar12 = getAddress(pEVar5);
      pTVar11 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                          (&local_378);
      (pTVar11->initial).addr = AVar12.addr;
      pTVar11 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                          (&local_378);
      checkAddress((Address)(pTVar11->initial).addr,"excessive table init size",pEVar5);
    }
    uVar6 = (ulong)func._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_;
    sVar4 = Element::size(local_5f0);
    uVar16 = func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_;
    if (uVar6 < sVar4 - 1) {
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ =
           func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ + 1;
      pEVar5 = Element::operator[](local_5f0,uVar16);
      AVar12 = getAddress(pEVar5);
      pTVar11 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                          (&local_378);
      (pTVar11->max).addr = AVar12.addr;
      pTVar11 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                          (&local_378);
      memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
           (pTVar11->max).addr;
      checkAddress((Address)memory._M_t.
                            super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                            .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,
                   "excessive table max size",pEVar5);
    }
    else {
      pTVar11 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                          (&local_378);
      wasm::Address::operator=(&pTVar11->max,0xffffffff);
    }
    Module::addTable(this->wasm,&local_378);
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ =
         func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ + 1;
    std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&local_378);
  }
  else if (local_28 == 2) {
    std::make_unique<wasm::Memory>();
    pMVar13 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                        (&local_400);
    local_418 = (size_t)auStack_90;
    sStack_410 = name.super_IString.str._M_len;
    name__00.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
    name__00.super_IString.str._M_len = (size_t)auStack_90;
    pcVar15 = (char *)(ulong)(local_d1 & 1);
    Named::setName((Named *)pMVar13,name__00,SUB41(local_d1 & 1,0));
    local_438 = (size_t)auStack_260;
    sStack_430 = module.str._M_len;
    wasm::Name::Name(&local_428,(IString)_auStack_260);
    pMVar13 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                        (&local_400);
    wasm::Name::operator=(&(pMVar13->super_Importable).module,&local_428);
    limits = (Element *)auStack_298;
    sStack_450 = base.str._M_len;
    wasm::Name::Name(&local_448,(IString)_auStack_298);
    pMVar13 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                        (&local_400);
    wasm::Name::operator=(&(pMVar13->super_Importable).base,&local_448);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              (&this->memoryNames,(value_type *)auStack_90);
    pEVar5 = Element::operator[](local_5f0,
                                 func._M_t.
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_)
    ;
    bVar3 = Element::isList(pEVar5);
    if (bVar3) {
      local_460 = Element::operator[](local_5f0,
                                      func._M_t.
                                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl.
                                      _4_4_);
      local_478 = SHARED._0_8_;
      uStack_470 = SHARED._8_8_;
      str_03.str._M_str = pcVar15;
      str_03.str._M_len = SHARED._8_8_;
      bVar3 = elementStartsWith((wasm *)local_460,(Element *)SHARED._0_8_,str_03);
      if (!bVar3) {
        tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
        super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._6_1_ = 1;
        pPVar7 = (ParseException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_498,"bad memory limit declaration",
                   (allocator<char> *)
                   ((long)&tag._M_t.
                           super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                           super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                           super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 7));
        pEVar5 = Element::operator[](local_5f0,
                                     func._M_t.
                                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                     .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl.
                                     _4_4_);
        sVar4 = pEVar5->line;
        pEVar5 = Element::operator[](local_5f0,
                                     func._M_t.
                                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                     .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl.
                                     _4_4_);
        ParseException::ParseException(pPVar7,&local_498,sVar4,pEVar5->col);
        tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
        super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._6_1_ = 0;
        __cxa_throw(pPVar7,&ParseException::typeinfo,ParseException::~ParseException);
      }
      pMVar13 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (&local_400);
      pMVar13->shared = true;
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ =
           parseMemoryLimits(this,local_460,1,&local_400);
    }
    else {
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ =
           parseMemoryLimits(this,local_5f0,
                             func._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_,
                             &local_400);
    }
    Module::addMemory(this->wasm,&local_400);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_400);
  }
  else if (local_28 == 4) {
    std::make_unique<wasm::Tag>();
    HeapType::HeapType(&local_4b0);
    sVar4 = parseTypeUse(this,local_5f0,
                         (ulong)func._M_t.
                                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_,
                         &local_4b0);
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_ = (uint)sVar4;
    local_4c0 = HeapType::getSignature(&local_4b0);
    pTVar14 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                        ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&tagType);
    pTVar14->sig = local_4c0;
    pTVar14 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                        ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&tagType);
    local_4d8 = (size_t)auStack_90;
    sStack_4d0 = name.super_IString.str._M_len;
    name_.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
    name_.super_IString.str._M_len = (size_t)auStack_90;
    Named::setName((Named *)pTVar14,name_,(bool)(local_d1 & 1));
    local_4f8 = (size_t)auStack_260;
    sStack_4f0 = module.str._M_len;
    wasm::Name::Name(&local_4e8,(IString)_auStack_260);
    pTVar14 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                        ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&tagType);
    wasm::Name::operator=(&(pTVar14->super_Importable).module,&local_4e8);
    local_518 = (size_t)auStack_298;
    sStack_510 = base.str._M_len;
    wasm::Name::Name(&local_508,(IString)_auStack_298);
    pTVar14 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->
                        ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&tagType);
    wasm::Name::operator=(&(pTVar14->super_Importable).base,&local_508);
    pMVar2 = this->wasm;
    pTVar14 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::release
                        ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&tagType);
    Module::addTag(pMVar2,pTVar14);
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr
              ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&tagType);
  }
  uVar6 = (ulong)func._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_;
  sVar4 = Element::size(local_5f0);
  if (sVar4 <= uVar6) {
    return;
  }
  pPVar7 = (ParseException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"invalid element",&local_539);
  pEVar5 = Element::operator[](local_5f0,
                               func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_);
  sVar4 = pEVar5->line;
  pEVar5 = Element::operator[](local_5f0,
                               func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._4_4_);
  ParseException::ParseException(pPVar7,&local_538,sVar4,pEVar5->col);
  __cxa_throw(pPVar7,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

void SExpressionWasmBuilder::parseImport(Element& s) {
  size_t i = 1;
  // (import "env" "STACKTOP" (global $stackTop i32))
  bool newStyle = s.size() == 4 && s[3]->isList();
  auto kind = ExternalKind::Invalid;
  if (newStyle) {
    if (elementStartsWith(*s[3], FUNC)) {
      kind = ExternalKind::Function;
    } else if (elementStartsWith(*s[3], MEMORY)) {
      kind = ExternalKind::Memory;
    } else if (elementStartsWith(*s[3], TABLE)) {
      kind = ExternalKind::Table;
    } else if (elementStartsWith(*s[3], GLOBAL)) {
      kind = ExternalKind::Global;
    } else if ((*s[3])[0]->str() == TAG) {
      kind = ExternalKind::Tag;
    } else {
      newStyle = false; // either (param..) or (result..)
    }
  }
  Index newStyleInner = 1;
  Name name;
  if (s.size() > 3 && s[3]->isStr()) {
    name = s[i++]->str();
  } else if (newStyle && newStyleInner < s[3]->size() &&
             (*s[3])[newStyleInner]->dollared()) {
    name = (*s[3])[newStyleInner++]->str();
  }
  bool hasExplicitName = name.is();
  if (!hasExplicitName) {
    if (kind == ExternalKind::Function) {
      name = Name("fimport$" + std::to_string(functionCounter++));
      functionNames.push_back(name);
    } else if (kind == ExternalKind::Global) {
      // Handled in `parseGlobal`.
    } else if (kind == ExternalKind::Memory) {
      name = Name("mimport$" + std::to_string(memoryCounter++));
    } else if (kind == ExternalKind::Table) {
      name = Name("timport$" + std::to_string(tableCounter++));
    } else if (kind == ExternalKind::Tag) {
      name = Name("eimport$" + std::to_string(tagCounter++));
      tagNames.push_back(name);
    } else {
      throw ParseException("invalid import", s[3]->line, s[3]->col);
    }
  }
  if (!newStyle) {
    kind = ExternalKind::Function;
  }
  auto module = s[i++]->str();
  if (!s[i]->isStr()) {
    throw ParseException("no name for import", s[i]->line, s[i]->col);
  }
  auto base = s[i]->str();
  if (!module.size() || !base.size()) {
    throw ParseException(
      "imports must have module and base", s[i]->line, s[i]->col);
  }
  i++;
  // parse internals
  Element& inner = newStyle ? *s[3] : s;
  Index j = newStyle ? newStyleInner : i;
  if (kind == ExternalKind::Function) {
    auto func = std::make_unique<Function>();

    j = parseTypeUse(inner, j, func->type);
    func->setName(name, hasExplicitName);
    func->module = module;
    func->base = base;
    functionTypes[name] = func->type;
    wasm.addFunction(func.release());
  } else if (kind == ExternalKind::Global) {
    parseGlobal(inner, true);
    j++;
    auto& global = wasm.globals.back();
    global->module = module;
    global->base = base;
  } else if (kind == ExternalKind::Table) {
    auto table = std::make_unique<Table>();
    table->setName(name, hasExplicitName);
    table->module = module;
    table->base = base;
    tableNames.push_back(name);

    if (j < inner.size() - 1) {
      auto initElem = inner[j++];
      table->initial = getAddress(initElem);
      checkAddress(table->initial, "excessive table init size", initElem);
    }
    if (j < inner.size() - 1) {
      auto maxElem = inner[j++];
      table->max = getAddress(maxElem);
      checkAddress(table->max, "excessive table max size", maxElem);
    } else {
      table->max = Table::kUnlimitedSize;
    }

    wasm.addTable(std::move(table));

    j++; // funcref
    // ends with the table element type
  } else if (kind == ExternalKind::Memory) {
    auto memory = std::make_unique<Memory>();
    memory->setName(name, hasExplicitName);
    memory->module = module;
    memory->base = base;
    memoryNames.push_back(name);

    if (inner[j]->isList()) {
      auto& limits = *inner[j];
      if (!elementStartsWith(limits, SHARED)) {
        throw ParseException(
          "bad memory limit declaration", inner[j]->line, inner[j]->col);
      }
      memory->shared = true;
      j = parseMemoryLimits(limits, 1, memory);
    } else {
      j = parseMemoryLimits(inner, j, memory);
    }

    wasm.addMemory(std::move(memory));
  } else if (kind == ExternalKind::Tag) {
    auto tag = std::make_unique<Tag>();
    HeapType tagType;
    j = parseTypeUse(inner, j, tagType);
    tag->sig = tagType.getSignature();
    tag->setName(name, hasExplicitName);
    tag->module = module;
    tag->base = base;
    wasm.addTag(tag.release());
  }
  // If there are more elements, they are invalid
  if (j < inner.size()) {
    throw ParseException("invalid element", inner[j]->line, inner[j]->col);
  }
}